

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat __thiscall Mat::Inverse(Mat *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  double *__s;
  double *pdVar4;
  ulong uVar5;
  double *extraout_RDX;
  size_t __n;
  Mat *in_RSI;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  Mat MVar10;
  Mat yy;
  Mat xx;
  double *local_b0;
  double *local_a8;
  Mat local_a0;
  Mat *local_90;
  Mat *local_88;
  ulong local_80;
  ulong local_78;
  Mat local_70;
  Mat local_60;
  Mat local_50;
  Mat local_40;
  
  uVar1 = in_RSI->n_rows_;
  uVar7 = (ulong)uVar1;
  this->n_rows_ = uVar1;
  this->n_cols_ = uVar1;
  local_90 = in_RSI;
  local_88 = this;
  if (uVar7 == 0) {
    this->v_ = (double *)0x0;
    local_b0 = (double *)0x0;
LAB_00105216:
    bVar3 = false;
  }
  else {
    local_b0 = (double *)operator_new__((ulong)(uVar1 * uVar1) << 3);
    this->v_ = local_b0;
    bVar3 = 0 < (int)uVar1;
    if ((int)uVar1 < 1) goto LAB_00105216;
    uVar6 = 0;
    iVar9 = 0;
    uVar8 = uVar7;
    do {
      memset(local_b0 + uVar6,0,uVar7 * 8);
      local_b0[iVar9] = 1.0;
      iVar9 = iVar9 + uVar1 + 1;
      uVar6 = (ulong)((int)uVar6 + uVar1);
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  __n = uVar7 * 8;
  uVar2 = local_90->n_cols_;
  uVar8 = (ulong)uVar2;
  local_70.n_cols_ = 1;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (int)uVar1) {
    uVar6 = __n;
  }
  local_70.n_rows_ = uVar1;
  __s = (double *)operator_new__(uVar6);
  local_70.v_ = __s;
  if (bVar3) {
    memset(__s,0,__n);
  }
  local_a0.n_cols_ = 1;
  local_a0.n_rows_ = uVar1;
  pdVar4 = (double *)operator_new__(uVar6);
  local_a0.v_ = pdVar4;
  if (bVar3) {
    memset(pdVar4,0,__n);
  }
  if (0 < (int)uVar2) {
    uVar6 = 0;
    local_a8 = local_b0;
    local_80 = uVar8;
    do {
      if (bVar3) {
        uVar8 = 0;
        pdVar4 = local_a8;
        local_78 = uVar6;
        do {
          __s[uVar8] = *pdVar4;
          Mat(&local_60,&local_70);
          GaussLin(&local_50,local_90,(int)&local_60);
          operator=(&local_40,&local_a0);
          if (local_40.v_ != (double *)0x0) {
            operator_delete__(local_40.v_);
          }
          if (local_50.v_ != (double *)0x0) {
            operator_delete__(local_50.v_);
          }
          if (local_60.v_ != (double *)0x0) {
            operator_delete__(local_60.v_);
          }
          uVar8 = uVar8 + 1;
          pdVar4 = pdVar4 + uVar7;
        } while (uVar7 != uVar8);
        uVar6 = local_78;
        uVar8 = local_80;
        if (bVar3) {
          uVar5 = 0;
          pdVar4 = local_a8;
          do {
            *pdVar4 = local_a0.v_[uVar5];
            uVar5 = uVar5 + 1;
            pdVar4 = pdVar4 + uVar7;
          } while (uVar7 != uVar5);
        }
      }
      uVar6 = uVar6 + 1;
      local_a8 = local_a8 + 1;
    } while (uVar6 != uVar8);
    pdVar4 = local_a0.v_;
    if (local_a0.v_ == (double *)0x0) goto LAB_001053ca;
  }
  operator_delete__(pdVar4);
LAB_001053ca:
  operator_delete__(__s);
  MVar10.v_ = extraout_RDX;
  MVar10._0_8_ = local_88;
  return MVar10;
}

Assistant:

Mat Mat::Inverse() const
{
	int i,j;
	int n = n_rows_;
	Mat ainv(n,n);
	for (i=0; i<n; i++) {
		for (j=0; j<n; j++) ainv(i,j) = 0.;
		ainv(i,i) = 1.;
	}
	int m = n_cols_;	
	Mat xx(n), yy(n);
	for (j = 0; j < m; j++) {
		for (i=0; i<n; i++) {
			xx(i) = ainv(i,j);
			yy = GaussLin(xx,n);
		}
		for (i=0; i<n; i++)
			ainv(i,j) = yy(i);
	}
	return ainv;
}